

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *in_RDX;
  SQUnsignedInteger in_RSI;
  SQObjectPtr *in_RDI;
  
  if ((-1 < (long)in_RSI) &&
     (SVar1 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 3)),
     (long)in_RSI < (long)SVar1)) {
    sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 3),in_RSI);
    ::SQObjectPtr::operator=(in_RDX,in_RDI);
    return true;
  }
  return false;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if(nidx>=0 && nidx<(SQInteger)_values.size()){
            _values[nidx]=val;
            return true;
        }
        else return false;
    }